

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Node.h
# Opt level: O1

Node<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_> *
__thiscall
duckdb_skiplistlib::skip_list::
Node<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>::
_adjRemoveRefs(Node<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>
               *this,size_t level,
              Node<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>
              *pNode)

{
  ulong uVar1;
  pointer pNVar2;
  size_t sVar3;
  Node<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_> *pNVar4;
  size_t sVar5;
  ulong uVar6;
  pointer pNVar7;
  long lVar8;
  ulong uVar9;
  size_t *psVar10;
  
  uVar6 = (pNode->_nodeRefs)._swapLevel;
  uVar9 = level + (level < uVar6);
  if ((uVar6 < (ulong)((long)(pNode->_nodeRefs)._nodes.
                             super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(pNode->_nodeRefs)._nodes.
                             super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 4)) &&
     (pNVar7 = (this->_nodeRefs)._nodes.
               super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
     uVar9 < (ulong)((long)(this->_nodeRefs)._nodes.
                           super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)pNVar7 >> 4))) {
    uVar6 = uVar9 * 0x10 | 8;
    do {
      uVar1 = (pNode->_nodeRefs)._swapLevel;
      pNVar2 = (pNode->_nodeRefs)._nodes.
               super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(pNode->_nodeRefs)._nodes.
                        super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)pNVar2 >> 4) <= uVar1)
      break;
      *(long *)((long)&pNVar2->pNode + uVar6) =
           *(long *)((long)&pNVar7->pNode + uVar6) + *(long *)((long)&pNVar2->pNode + uVar6) + -1;
      pNVar4 = pNVar7[uVar1].pNode;
      sVar3 = pNVar7[uVar1].width;
      sVar5 = pNVar2[uVar1].width;
      pNVar7[uVar1].pNode = pNVar2[uVar1].pNode;
      pNVar7[uVar1].width = sVar5;
      pNVar7 = (pNode->_nodeRefs)._nodes.
               super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + (pNode->_nodeRefs)._swapLevel;
      pNVar7->pNode = pNVar4;
      pNVar7->width = sVar3;
      psVar10 = &(pNode->_nodeRefs)._swapLevel;
      *psVar10 = *psVar10 + 1;
      uVar9 = uVar9 + 1;
      pNVar7 = (this->_nodeRefs)._nodes.
               super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar6 = uVar6 + 0x10;
    } while (uVar9 < (ulong)((long)(this->_nodeRefs)._nodes.
                                   super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pNVar7 >> 4));
  }
  pNVar7 = (this->_nodeRefs)._nodes.
           super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar6 = (long)(this->_nodeRefs)._nodes.
                super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pNVar7 >> 4;
  lVar8 = uVar6 - uVar9;
  if (uVar9 <= uVar6 && lVar8 != 0) {
    sVar3 = (pNode->_nodeRefs)._swapLevel;
    psVar10 = &pNVar7[uVar9].width;
    do {
      *psVar10 = *psVar10 - 1;
      psVar10 = psVar10 + 2;
      lVar8 = lVar8 + -1;
    } while (lVar8 != 0);
    (pNode->_nodeRefs)._swapLevel = (uVar6 + sVar3) - uVar9;
  }
  return pNode;
}

Assistant:

Node<T, _Compare> *Node<T, _Compare>::_adjRemoveRefs(size_t level, Node<T, _Compare> *pNode) {
    assert(pNode);
    SwappableNodeRefStack<T, _Compare> &thatRefs = pNode->_nodeRefs;

    assert(pNode != this);
    if (level < thatRefs.swapLevel()) {
        assert(level == thatRefs.swapLevel() - 1);
        ++level;
    }
    if (thatRefs.canSwap()) {
        assert(level == thatRefs.swapLevel());
        while (level < _nodeRefs.height() && thatRefs.canSwap()) {
            assert(level == thatRefs.swapLevel());
            // Compute the new width for the new node
            thatRefs[level].width += _nodeRefs[level].width - 1;
            thatRefs.swap(_nodeRefs);
            ++level;
        }
        assert(thatRefs.canSwap() || thatRefs.allNodePointerMatch(pNode));
    }
    // Decrement my widths as my refs are over the top of the missing pNode.
    while (level < _nodeRefs.height()) {
        _nodeRefs[level].width -= 1;
        ++level;
        thatRefs.incSwapLevel();
    }
    assert(! _nodeRefs.canSwap());
    return pNode;
}